

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pprint.c
# Opt level: O3

void prvTidyPPrintTree(TidyDocImpl *doc,uint mode,uint indent,Node *node)

{
  int iVar1;
  Dict *pDVar2;
  TidyDocImpl *pTVar3;
  ulong uVar4;
  Bool BVar5;
  Bool BVar6;
  Dict *pDVar7;
  Node *node_00;
  TidyTagId TVar8;
  uint *node_01;
  Node *pNVar9;
  Node *pNVar10;
  uint extraout_EDX;
  uint extraout_EDX_00;
  uint extraout_EDX_01;
  uint extraout_EDX_02;
  uint extraout_EDX_03;
  uint extraout_EDX_04;
  uint extraout_EDX_05;
  uint extraout_EDX_06;
  uint extraout_EDX_07;
  uint extraout_EDX_08;
  undefined8 extraout_RDX;
  undefined8 uVar11;
  undefined8 extraout_RDX_00;
  TidyDocImpl *doc_00;
  uint uVar12;
  int local_48;
  int local_40;
  
  if (node == (Node *)0x0) {
    return;
  }
  BVar6 = *(Bool *)((doc->config).value + 0x26);
  iVar1 = *(int *)((doc->config).value + 0x62);
  if (doc->progressCallback != (TidyPPProgress)0x0) {
    (*doc->progressCallback)((TidyDoc)doc,node->line,node->column,(doc->pprint).line + 1);
  }
  node_01 = &switchD_001463e7::switchdataD_0015d580;
  switch(node->type) {
  case RootNode:
    for (pNVar10 = node->content; pNVar10 != (Node *)0x0; pNVar10 = pNVar10->next) {
      prvTidyPPrintTree(doc,mode,indent,pNVar10);
    }
    return;
  case DocTypeTag:
    PPrintDocType(doc,indent,node);
    return;
  case CommentTag:
    PPrintComment(doc,indent,node);
    return;
  case ProcInsTag:
    PPrintPI(doc,indent,node);
    return;
  case TextNode:
    PPrintText(doc,mode,indent,node);
    return;
  case CDATATag:
    PPrintCDATA(doc,indent,node);
    return;
  case SectionTag:
    PPrintSection(doc,indent,node);
    return;
  case AspTag:
    PPrintAsp(doc,indent,node);
    return;
  case JsteTag:
    PPrintJste(doc,indent,node);
    return;
  case PhpTag:
    PPrintPhp(doc,indent,node);
    return;
  case XmlDecl:
    PPrintXmlDecl(doc,indent,node);
    return;
  }
  if ((node->tag != (Dict *)0x0) && (node->tag->id == TidyTag_MATHML)) {
    PPrintMathML(doc,indent,node);
    return;
  }
  BVar5 = prvTidynodeCMIsEmpty(node);
  if ((BVar5 != no) || ((node->type == StartEndTag && (iVar1 == 0)))) {
    BVar6 = prvTidynodeHasCM(node,0x10);
    if (BVar6 == no) {
      PCondFlushLineSmart(doc,indent);
    }
    pDVar7 = node->tag;
    if (pDVar7 != (Dict *)0x0) {
      TVar8 = pDVar7->id;
      if (TVar8 == TidyTag_BR) {
        if (node->prev != (Node *)0x0) {
          pDVar2 = node->prev->tag;
          if (pDVar2 == (Dict *)0x0) {
            if ((mode & 1) == 0) goto LAB_001466fe;
          }
          else if (((mode & 1) == 0) && (pDVar2->id != TidyTag_BR)) {
LAB_001466fe:
            if (*(int *)((doc->config).value + 7) != 0) {
              PFlushLineSmart(doc,indent);
              pDVar7 = node->tag;
              if (pDVar7 == (Dict *)0x0) goto LAB_00146744;
            }
          }
        }
        TVar8 = pDVar7->id;
      }
      if ((((TVar8 == TidyTag_HR) && (*(int *)((doc->config).value + 0x57) == 1)) &&
          (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
        PFlushLineSmart(doc,indent);
      }
    }
LAB_00146744:
    PPrintTag(doc,mode,indent,node);
    if (node->next == (Node *)0x0) {
      return;
    }
    if (node->tag == (Dict *)0x0) {
      return;
    }
    TVar8 = node->tag->id;
    if ((TVar8 == TidyTag_PARAM) || (TVar8 == TidyTag_AREA)) {
      PCondFlushLineSmart(doc,indent);
      return;
    }
    if ((((byte)mode | TVar8 != TidyTag_BR) & TVar8 != TidyTag_HR) != 0) {
      return;
    }
    goto LAB_001467a7;
  }
  if (node->type == StartEndTag) {
    node->type = StartTag;
  }
  pDVar7 = node->tag;
  if (pDVar7 != (Dict *)0x0) {
    if (pDVar7->parser != prvTidyParsePre) {
      TVar8 = pDVar7->id;
      if ((TVar8 == TidyTag_SCRIPT) || (TVar8 == TidyTag_STYLE)) {
        PPrintScriptStyle(doc,mode | 0x19,indent,node);
        return;
      }
      node_01 = (uint *)prvTidyParsePre;
      if (TVar8 != TidyTag_TEXTAREA) goto LAB_00146697;
    }
    iVar1 = *(int *)((doc->config).value + 0x57);
    PCondFlushLineSmart(doc,indent);
    if (((iVar1 == 1) && (node->parent != (Node *)0x0)) && (node->parent->content != node)) {
      PFlushLineSmart(doc,indent);
    }
    pNVar9 = node;
    PPrintTag(doc,mode | 8,indent,node);
    pNVar10 = node->content;
    uVar12 = extraout_EDX;
    if (pNVar10 != (Node *)0x0) {
      do {
        pNVar9 = pNVar10;
        prvTidyPPrintTree(doc,mode | 9,0,pNVar10);
        pNVar10 = pNVar10->next;
        uVar12 = extraout_EDX_00;
      } while (pNVar10 != (Node *)0x0);
    }
    PPrintEndTag(doc,(uint)node->element,uVar12,pNVar9);
    if (*(int *)((doc->config).value + 0x25) != 0) {
      return;
    }
    if (node->next == (Node *)0x0) {
      return;
    }
    goto LAB_001467a7;
  }
LAB_00146697:
  BVar5 = prvTidynodeCMIsInline(node);
  if (BVar5 != no) {
    if (((*(int *)((doc->config).value + 0x30) != 0) && (node->tag != (Dict *)0x0)) &&
       (node->tag->id == TidyTag_NOBR)) {
      pNVar10 = node->content;
      if (pNVar10 == (Node *)0x0) {
        return;
      }
      do {
        prvTidyPPrintTree(doc,mode | 8,indent,pNVar10);
        pNVar10 = pNVar10->next;
      } while (pNVar10 != (Node *)0x0);
      return;
    }
    pNVar10 = node;
    PPrintTag(doc,mode,indent,node);
    BVar5 = ShouldIndent((TidyDocImpl *)(doc->config).value[0x25].p,node);
    if (BVar5 == no) {
      uVar11 = extraout_RDX;
      for (pNVar9 = node->content; uVar12 = (uint)uVar11, pNVar9 != (Node *)0x0;
          pNVar9 = pNVar9->next) {
        pNVar10 = pNVar9;
        prvTidyPPrintTree(doc,mode,indent,pNVar9);
        uVar11 = extraout_RDX_00;
      }
    }
    else {
      PCondFlushLineSmart(doc,BVar6 + indent);
      for (pNVar9 = node->content; pNVar9 != (Node *)0x0; pNVar9 = pNVar9->next) {
        pNVar10 = pNVar9;
        prvTidyPPrintTree(doc,mode,BVar6 + indent,pNVar9);
      }
      PCondFlushLineSmart(doc,indent);
      uVar12 = extraout_EDX_01;
    }
    PPrintEndTag(doc,(uint)node->element,uVar12,pNVar10);
    return;
  }
  pTVar3 = (TidyDocImpl *)(doc->config).value[0x25].v;
  uVar4 = (doc->config).value[0x3b].v;
  iVar1 = *(int *)((doc->config).value + 0x57);
  doc_00 = pTVar3;
  if (((iVar1 == 1) && (node->parent != (Node *)0x0)) &&
     ((node->parent->content != node &&
      ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_HTML)))))) {
    PFlushLineSmart(doc,indent);
    doc_00 = (TidyDocImpl *)(doc->config).value[0x25].p;
  }
  BVar5 = ShouldIndent(doc_00,node);
  if (BVar5 != no) {
    BVar5 = BVar6;
  }
  uVar12 = BVar5 + indent;
  PCondFlushLineSmart(doc,indent);
  local_40 = (int)uVar4;
  if (((local_40 == 0) || (BVar5 = prvTidynodeHasCM(node,0x200000), BVar5 == no)) ||
     (node->attributes != (AttVal *)0x0)) {
    node_01 = (uint *)node;
    PPrintTag(doc,mode,indent,node);
    BVar6 = ShouldIndent((TidyDocImpl *)(doc->config).value[0x25].p,node);
    if (BVar6 == no) {
      BVar6 = prvTidynodeHasCM(node,2);
      if (((BVar6 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_NOFRAMES)))) ||
         ((BVar6 = prvTidynodeHasCM(node,4), BVar6 != no &&
          ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TITLE)))))) {
        PFlushLineSmart(doc,uVar12);
      }
    }
    else if (((node->tag == (Dict *)0x0) || (node->tag->id != TidyTag_LI)) ||
            (BVar6 = prvTidynodeIsText(node->content), BVar6 == no)) {
      PCondFlushLineSmart(doc,uVar12);
    }
  }
  else {
    BVar5 = ShouldIndent((TidyDocImpl *)(doc->config).value[0x25].p,node);
    if (BVar5 == no) {
      BVar6 = no;
    }
    uVar12 = uVar12 - BVar6;
  }
  local_48 = (int)pTVar3;
  if (node->content != (Node *)0x0) {
    pNVar10 = node->content;
    pNVar9 = (Node *)0x0;
    do {
      node_00 = pNVar10;
      if (((pNVar9 != (Node *)0x0 && local_48 == 0) &&
          (BVar6 = prvTidynodeIsText(pNVar9), BVar6 != no)) &&
         ((node_00->tag != (Dict *)0x0 && (BVar6 = prvTidynodeHasCM(node_00,0x10), BVar6 == no)))) {
        PFlushLineSmart(doc,uVar12);
      }
      node_01 = (uint *)node_00;
      prvTidyPPrintTree(doc,mode,uVar12,node_00);
      pNVar10 = node_00->next;
      pNVar9 = node_00;
    } while (node_00->next != (Node *)0x0);
  }
  BVar6 = ShouldIndent((TidyDocImpl *)(doc->config).value[0x25].p,node);
  if (BVar6 == no) {
    if (local_40 == 0) {
      BVar6 = prvTidynodeHasCM(node,2);
      if (((BVar6 != no) || ((node->tag != (Dict *)0x0 && (node->tag->id == TidyTag_NOFRAMES)))) ||
         ((BVar6 = prvTidynodeHasCM(node,4), uVar12 = extraout_EDX_06, BVar6 != no &&
          ((node->tag == (Dict *)0x0 || (node->tag->id != TidyTag_TITLE)))))) {
        PCondFlushLineSmart(doc,indent);
        uVar12 = extraout_EDX_05;
        goto LAB_00146b44;
      }
    }
    else {
      BVar6 = prvTidynodeHasCM(node,0x8000);
      uVar12 = extraout_EDX_04;
      if (BVar6 != no) {
        if ((doc->pprint).indent[0].spaces != indent) {
          (doc->pprint).indent[0].spaces = indent;
        }
        goto LAB_00146b50;
      }
    }
    if (iVar1 == 1) {
      for (pNVar10 = node->content; pNVar10 != (Node *)0x0; pNVar10 = pNVar10->next) {
        BVar6 = prvTidynodeIsText(pNVar10);
        uVar12 = extraout_EDX_07;
        if (BVar6 != no) goto LAB_00146b44;
      }
      PFlushLineSmart(doc,indent);
      uVar12 = extraout_EDX_08;
    }
LAB_00146b44:
    PPrintEndTag(doc,(uint)node->element,uVar12,(Node *)node_01);
  }
  else {
    PCondFlushLineSmart(doc,indent);
    uVar12 = extraout_EDX_02;
    if ((local_40 == 0) ||
       (BVar6 = prvTidynodeHasCM(node,0x8000), uVar12 = extraout_EDX_03, BVar6 == no))
    goto LAB_00146b44;
  }
LAB_00146b50:
  if (local_40 == 0 && local_48 == 0) {
    if (node->tag != (Dict *)0x0) {
      if ((iVar1 != 1) && (node->tag->id != TidyTag_HTML)) goto LAB_001467a7;
      goto LAB_00146b5a;
    }
    if (iVar1 != 1) goto LAB_001467a7;
  }
  else {
LAB_00146b5a:
    if (iVar1 != 1) {
      return;
    }
  }
  if ((node->next == (Node *)0x0) || (BVar6 = prvTidynodeHasCM(node,0xe8), BVar6 == no)) {
    return;
  }
LAB_001467a7:
  PFlushLineSmart(doc,indent);
  return;
}

Assistant:

void TY_(PPrintTree)( TidyDocImpl* doc, uint mode, uint indent, Node *node )
{
    Node *content, *last;
    uint spaces = cfg( doc, TidyIndentSpaces );
    Bool xhtml = cfgBool( doc, TidyXhtmlOut );

    if ( node == NULL )
        return;

    if (doc->progressCallback)
    {
        doc->progressCallback( tidyImplToDoc(doc), node->line, node->column, doc->pprint.line + 1 );
    }

#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_PPRINT)
    dbg_show_node( doc, node, 4, GetSpaces( &doc->pprint ) );
#endif

    if (node->type == TextNode)
    {
        PPrintText( doc, mode, indent, node );
    }
    else if ( node->type == CommentTag )
    {
        PPrintComment( doc, indent, node );
    }
    else if ( node->type == RootNode )
    {
        for ( content = node->content; content; content = content->next )
           TY_(PPrintTree)( doc, mode, indent, content );
    }
    else if ( node->type == DocTypeTag )
        PPrintDocType( doc, indent, node );
    else if ( node->type == ProcInsTag)
        PPrintPI( doc, indent, node );
    else if ( node->type == XmlDecl)
        PPrintXmlDecl( doc, indent, node );
    else if ( node->type == CDATATag)
        PPrintCDATA( doc, indent, node );
    else if ( node->type == SectionTag)
        PPrintSection( doc, indent, node );
    else if ( node->type == AspTag)
        PPrintAsp( doc, indent, node );
    else if ( node->type == JsteTag)
        PPrintJste( doc, indent, node );
    else if ( node->type == PhpTag)
        PPrintPhp( doc, indent, node );
    else if ( nodeIsMATHML(node) )
        PPrintMathML( doc, indent, node ); /* #130 MathML attr and entity fix! */
    else if ( TY_(nodeCMIsEmpty)(node) ||
              (node->type == StartEndTag && !xhtml) )
    {
        /* Issue #8 - flush to new line? 
           maybe use if ( TY_(nodeHasCM)(node, CM_BLOCK) ) instead
           or remove the CM_INLINE from the tag
         */
        if ( ! TY_(nodeHasCM)(node, CM_INLINE) )
            PCondFlushLineSmart( doc, indent );

        if ( nodeIsBR(node) && node->prev &&
             !(nodeIsBR(node->prev) || (mode & PREFORMATTED)) &&
             cfgBool(doc, TidyBreakBeforeBR) )
            PFlushLineSmart( doc, indent );

        if ( nodeIsHR(node) )
        {
            /* insert extra newline for classic formatting */
            Bool classic = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }
        }

        PPrintTag( doc, mode, indent, node );

        if (node->next)
        {
          if (nodeIsPARAM(node) || nodeIsAREA(node))
              PCondFlushLineSmart(doc, indent);
          else if ((nodeIsBR(node) && !(mode & PREFORMATTED))
                   || nodeIsHR(node))
              PFlushLineSmart(doc, indent);
        }
    }
    else /* some kind of container element */
    {
        if ( node->type == StartEndTag )
            node->type = StartTag;

        if ( node->tag && 
             (node->tag->parser == TY_(ParsePre) || nodeIsTEXTAREA(node)) )
        {
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint indprev = indent;

            PCondFlushLineSmart( doc, indent ); /* about to add <pre> tag - clear any previous */

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node)
            {
                PFlushLineSmart( doc, indent );
            }

            /* Issue #697 - Add NOWRAP to the mode */
            PPrintTag( doc, (mode | NOWRAP), indent, node );   /* add <pre> or <textarea> tag */

            indent = 0;
            /* @camoy Fix #158 - remove inserted newlines in pre - PFlushLineSmart( doc, indent ); */

            for ( content = node->content; content; content = content->next )
            {
                TY_(PPrintTree)( doc, (mode | PREFORMATTED | NOWRAP),
                                 indent, content );
            }

            /* @camoy Fix #158 - remove inserted newlines in pre - PCondFlushLineSmart( doc, indent ); */
            indent = indprev;
            PPrintEndTag( doc, mode, indent, node );

            if ( cfgAutoBool(doc, TidyIndentContent) == TidyNoState
                 && node->next != NULL )
                PFlushLineSmart( doc, indent );
        }
        else if ( nodeIsSTYLE(node) || nodeIsSCRIPT(node) )
        {
            PPrintScriptStyle( doc, (mode | PREFORMATTED | NOWRAP | CDATA),
                               indent, node );
        }
        else if ( TY_(nodeCMIsInline)(node) )
        {
            if ( cfgBool(doc, TidyMakeClean) )
            {
                /* replace <nobr>...</nobr> by &nbsp; or &#160; etc. */
                if ( nodeIsNOBR(node) )
                {
                    for ( content = node->content;
                          content != NULL;
                          content = content->next)
                        TY_(PPrintTree)( doc, mode|NOWRAP, indent, content );
                    return;
                }
            }

            /* otherwise a normal inline element */
            PPrintTag( doc, mode, indent, node );

            /* indent content for SELECT, TEXTAREA, MAP, OBJECT and APPLET */
            if ( ShouldIndent(doc, node) )
            {
                indent += spaces;
                PCondFlushLineSmart( doc, indent );

                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );

                indent -= spaces;
                PCondFlushLineSmart( doc, indent );
                /* PCondFlushLine( doc, indent ); */
            }
            else
            {
                for ( content = node->content;
                      content != NULL;
                      content = content->next )
                    TY_(PPrintTree)( doc, mode, indent, content );
            }
            PPrintEndTag( doc, mode, indent, node );
        }
        else /* other tags */
        {
            Bool indcont  = ( cfgAutoBool(doc, TidyIndentContent) != TidyNoState );
            /* Issue #582 - Seems this is no longer used
               Bool indsmart = ( cfgAutoBool(doc, TidyIndentContent) == TidyAutoState ); */
            Bool hideend  = cfgBool( doc, TidyOmitOptionalTags );
            Bool classic  = TidyClassicVS; /* #228 - cfgBool( doc, TidyVertSpace ); */
            uint contentIndent = indent;

            /* insert extra newline for classic formatting */
            if (classic && node->parent && node->parent->content != node && !nodeIsHTML(node))
            {
                PFlushLineSmart( doc, indent );
            }

            if ( ShouldIndent(doc, node) )
                contentIndent += spaces;

            PCondFlushLineSmart( doc, indent );

            /*\
             *  Issue #180 - with the above PCondFlushLine, 
             *  this adds an unnecessary additional line!
             *  Maybe only if 'classic' ie --vertical-space yes 
             *  Issue #582 - maybe this is no longer needed!
             *  It adds a 3rd newline if indent: auto...
             *  if ( indsmart && node->prev != NULL && classic)
             *   PFlushLineSmart( doc, indent );
            \*/

            /* do not omit elements with attributes */
            if ( !hideend || !TY_(nodeHasCM)(node, CM_OMITST) ||
                 node->attributes != NULL )
            {
                PPrintTag( doc, mode, indent, node );

                if ( ShouldIndent(doc, node) )
                {
                    /* fix for bug 530791, don't wrap after */
                    /* <li> if first child is text node     */
                    if (!(nodeIsLI(node) && TY_(nodeIsText)(node->content)))
                        PCondFlushLineSmart( doc, contentIndent );
                }
                else if ( TY_(nodeHasCM)(node, CM_HTML) || nodeIsNOFRAMES(node) ||
                          (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node)) )
                    PFlushLineSmart( doc, contentIndent );
            }
            else if ( ShouldIndent(doc, node) )
            {
                /*\
                 * Issue #180 - If the tag was NOT printed due to the -omit option,
                 * then reduce the bumped indent under the same ShouldIndent(doc, node) 
                 * conditions that caused the indent to be bumped.
                \*/
                contentIndent -= spaces;
            }

            last = NULL;
            for ( content = node->content; content; content = content->next )
            {
                /* kludge for naked text before block level tag */
                if ( last && !indcont && TY_(nodeIsText)(last) &&
                     content->tag && !TY_(nodeHasCM)(content, CM_INLINE) )
                {
                    /* TY_(PFlushLine)(fout, indent); */
                    PFlushLineSmart( doc, contentIndent );
                }

                TY_(PPrintTree)( doc, mode, contentIndent, content );
                last = content;
            }

            /* don't flush line for td and th */
            if ( ShouldIndent(doc, node) ||
                 ( !hideend &&
                   ( TY_(nodeHasCM)(node, CM_HTML) || 
                     nodeIsNOFRAMES(node) ||
                     (TY_(nodeHasCM)(node, CM_HEAD) && !nodeIsTITLE(node))
                   )
                 )
               )
            {
                PCondFlushLineSmart( doc, indent );
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    PPrintEndTag( doc, mode, indent, node );
                    /* TY_(PFlushLine)( doc, indent ); */
                }
            }
            else
            {
                if ( !hideend || !TY_(nodeHasCM)(node, CM_OPT) )
                {
                    /* newline before endtag for classic formatting */
                    if ( classic && !HasMixedContent(node) )
                        PFlushLineSmart( doc, indent );
                    PPrintEndTag( doc, mode, indent, node );
                }
                else if (hideend)
                {
                    /* Issue #390  - must still deal with adjusting indent */
                    TidyPrintImpl* pprint = &doc->pprint;
                    if (pprint->indent[ 0 ].spaces != (int)indent)
                    {
#if defined(ENABLE_DEBUG_LOG) && defined(DEBUG_INDENT)
                        SPRTF("%s Indent from %d to %d\n", __FUNCTION__, pprint->indent[ 0 ].spaces, indent );
#endif  
                        pprint->indent[ 0 ].spaces = indent;
                    }
                }
            }

            if (!indcont && !hideend && !nodeIsHTML(node) && !classic)
                PFlushLineSmart( doc, indent );
            else if (classic && node->next != NULL && TY_(nodeHasCM)(node, CM_LIST|CM_DEFLIST|CM_TABLE|CM_BLOCK/*|CM_HEADING*/))
                PFlushLineSmart( doc, indent );
        }
    }
}